

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5AsciiCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  char *zLeft;
  char *zArg;
  bool bVar1;
  int iVar2;
  Fts5Tokenizer *p;
  int bTokenChars;
  long lVar3;
  
  if ((nArg & 1U) == 0) {
    p = (Fts5Tokenizer *)sqlite3_malloc(0x80);
    bVar1 = false;
    if (p != (Fts5Tokenizer *)0x0) {
      *(undefined8 *)(p + 0x70) = 0;
      *(undefined8 *)(p + 0x78) = 0;
      *(undefined8 *)(p + 0x60) = 0;
      *(undefined8 *)(p + 0x68) = 0;
      *(undefined8 *)(p + 0x50) = 0;
      *(undefined8 *)(p + 0x58) = 0;
      *(undefined8 *)(p + 0x40) = 0;
      *(undefined8 *)(p + 0x48) = 0;
      *(undefined8 *)(p + 0x30) = 0;
      *(undefined8 *)(p + 0x38) = 0;
      *(undefined8 *)(p + 0x20) = 0;
      *(undefined8 *)(p + 0x28) = 0;
      *(undefined8 *)(p + 0x10) = 0;
      *(undefined8 *)(p + 0x18) = 0;
      *(undefined8 *)p = 0;
      *(undefined8 *)(p + 8) = 0;
      memcpy(p,aAsciiTokenChar,0x80);
      for (lVar3 = 0; (!bVar1 && (lVar3 < nArg)); lVar3 = lVar3 + 2) {
        zLeft = azArg[lVar3];
        zArg = azArg[lVar3 + 1];
        iVar2 = sqlite3_stricmp(zLeft,"tokenchars");
        bTokenChars = 1;
        if (iVar2 == 0) {
LAB_001d5759:
          fts5AsciiAddExceptions((AsciiTokenizer *)p,zArg,bTokenChars);
          bVar1 = false;
        }
        else {
          iVar2 = sqlite3_stricmp(zLeft,"separators");
          bVar1 = true;
          if (iVar2 == 0) {
            bTokenChars = 0;
            goto LAB_001d5759;
          }
        }
      }
      if (bVar1) {
        sqlite3_free(p);
        iVar2 = 1;
        p = (Fts5Tokenizer *)0x0;
      }
      else {
        iVar2 = 0;
      }
      goto LAB_001d5791;
    }
    iVar2 = 7;
  }
  else {
    iVar2 = 1;
  }
  p = (Fts5Tokenizer *)0x0;
LAB_001d5791:
  *ppOut = p;
  return iVar2;
}

Assistant:

static int fts5AsciiCreate(
  void *pUnused,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;
  AsciiTokenizer *p = 0;
  UNUSED_PARAM(pUnused);
  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = sqlite3_malloc(sizeof(AsciiTokenizer));
    if( p==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int i;
      memset(p, 0, sizeof(AsciiTokenizer));
      memcpy(p->aTokenChar, aAsciiTokenChar, sizeof(aAsciiTokenChar));
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          fts5AsciiAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          fts5AsciiAddExceptions(p, zArg, 0);
        }else{
          rc = SQLITE_ERROR;
        }
      }
      if( rc!=SQLITE_OK ){
        fts5AsciiDelete((Fts5Tokenizer*)p);
        p = 0;
      }
    }
  }

  *ppOut = (Fts5Tokenizer*)p;
  return rc;
}